

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_gizmo(rf_vec3 position)

{
  undefined4 local_18;
  undefined4 uStack_14;
  
  rf_gfx_push_matrix();
  local_18 = position.x;
  uStack_14 = position.y;
  rf_gfx_translatef(local_18,uStack_14,position.z);
  rf_gfx_scalef(1.0,1.0,1.0);
  rf_gfx_begin(RF_LINES);
  rf_gfx_color3f(1.0,0.0,0.0);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color3f(1.0,0.0,0.0);
  rf_gfx_vertex3f(1.0,0.0,0.0);
  rf_gfx_color3f(0.0,1.0,0.0);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color3f(0.0,1.0,0.0);
  rf_gfx_vertex3f(0.0,1.0,0.0);
  rf_gfx_color3f(0.0,0.0,1.0);
  rf_gfx_vertex3f(0.0,0.0,0.0);
  rf_gfx_color3f(0.0,0.0,1.0);
  rf_gfx_vertex3f(0.0,0.0,1.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_gizmo(rf_vec3 position)
{
    // NOTE: RGB = XYZ
    float length = 1.0f;

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);
    rf_gfx_scalef(length, length, length);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color3f(1.0f, 0.0f, 0.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(1.0f, 0.0f, 0.0f); rf_gfx_vertex3f(1.0f, 0.0f, 0.0f);

    rf_gfx_color3f(0.0f, 1.0f, 0.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(0.0f, 1.0f, 0.0f); rf_gfx_vertex3f(0.0f, 1.0f, 0.0f);

    rf_gfx_color3f(0.0f, 0.0f, 1.0f); rf_gfx_vertex3f(0.0f, 0.0f, 0.0f);
    rf_gfx_color3f(0.0f, 0.0f, 1.0f); rf_gfx_vertex3f(0.0f, 0.0f, 1.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();
}